

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O1

void re2c::output_types(ostream *o,uint32_t ind,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *types)

{
  pointer pbVar1;
  opt_t *poVar2;
  ostream *poVar3;
  int iVar4;
  ulong uVar5;
  string str;
  char *local_68;
  long local_60;
  char local_58;
  undefined7 uStack_57;
  ostream *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  int local_34;
  
  local_68 = &local_58;
  local_60 = 0;
  local_58 = '\0';
  iVar4 = ind + 1;
  local_48 = o;
  local_40 = types;
  while( true ) {
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if ((poVar2->target == DOT) || (iVar4 = iVar4 + -1, iVar4 == 0)) break;
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)(poVar2->indString)._M_dataplus._M_p);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_48,local_68,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"enum ",5);
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(poVar2->yycondtype)._M_dataplus._M_p,
                      (poVar2->yycondtype)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," {\n",3);
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  if ((local_40->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (local_40->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_34 = ind + 2;
    uVar5 = 0;
    do {
      local_68 = &local_58;
      local_60 = 0;
      local_58 = '\0';
      iVar4 = local_34;
      while( true ) {
        poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
        if ((poVar2->target == DOT) || (iVar4 = iVar4 + -1, iVar4 == 0)) break;
        poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
        std::__cxx11::string::_M_append
                  ((char *)&local_68,(ulong)(poVar2->indString)._M_dataplus._M_p);
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_48,local_68,local_60);
      poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(poVar2->condEnumPrefix)._M_dataplus._M_p,
                          (poVar2->condEnumPrefix)._M_string_length);
      pbVar1 = (local_40->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,pbVar1[uVar5]._M_dataplus._M_p,pbVar1[uVar5]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\n",2);
      if (local_68 != &local_58) {
        operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 < (ulong)((long)(local_40->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_40->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_68 = &local_58;
  local_60 = 0;
  local_58 = '\0';
  iVar4 = ind + 1;
  while( true ) {
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if ((poVar2->target == DOT) || (iVar4 = iVar4 + -1, iVar4 == 0)) break;
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)(poVar2->indString)._M_dataplus._M_p);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_48,local_68,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"};\n",3);
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return;
}

Assistant:

void output_types (std::ostream & o, uint32_t ind, const std::vector<std::string> & types)
{
	o << indent (ind++) << "enum " << opts->yycondtype << " {\n";
	for (unsigned int i = 0; i < types.size (); ++i)
	{
		o << indent (ind) << opts->condEnumPrefix << types[i] << ",\n";
	}
	o << indent (--ind) << "};\n";
}